

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sexp_conflict sexp_thread_list(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  long lVar1;
  sexp_mark_stack_ptr_t *psVar2;
  sexp_conflict psVar3;
  sexp_conflict res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_30;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_30;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_30 = (sexp_conflict)0x23e;
  psVar2 = (((ctx->value).type.setters)->value).context.mark_stack[9].prev;
  if (((ulong)psVar2 & 3) == 0) {
    do {
      if (*(int *)&psVar2->start != 6) break;
      sexp_push_op(ctx,&local_30,psVar2->end);
      psVar2 = psVar2->prev;
    } while (((ulong)psVar2 & 3) == 0);
  }
  psVar3 = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[10].end;
  if (((ulong)psVar3 & 3) == 0) {
    do {
      if (psVar3->tag != 6) break;
      sexp_push_op(ctx,&local_30,(sexp_conflict)(psVar3->value).flonum);
      psVar3 = *(sexp_conflict *)((long)&psVar3->value + 8);
    } while (((ulong)psVar3 & 3) == 0);
  }
  lVar1 = sexp_memq_op(ctx,0,2,ctx,local_30);
  if (lVar1 == 0x3e) {
    sexp_push_op(ctx,&local_30,ctx);
  }
  (ctx->value).context.saves = local_28.next;
  return local_30;
}

Assistant:

sexp sexp_thread_list (sexp ctx, sexp self, sexp_sint_t n) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = SEXP_NULL;
#if SEXP_USE_GREEN_THREADS
  sexp ls;
  for (ls=sexp_global(ctx, SEXP_G_THREADS_FRONT); sexp_pairp(ls); ls=sexp_cdr(ls))
    sexp_push(ctx, res, sexp_car(ls));
  for (ls=sexp_global(ctx, SEXP_G_THREADS_PAUSED); sexp_pairp(ls); ls=sexp_cdr(ls))
    sexp_push(ctx, res, sexp_car(ls));
#endif
  if (sexp_not(sexp_memq(ctx, ctx, res))) sexp_push(ctx, res, ctx);
  sexp_gc_release1(ctx);
  return res;
}